

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

void __thiscall
wallet::LegacyScriptPubKeyMan::ReturnDestination
          (LegacyScriptPubKeyMan *this,int64_t nIndex,bool fInternal,CTxDestination *param_3)

{
  map<long,_CKeyID,_std::less<long>,_std::allocator<std::pair<const_long,_CKeyID>_>_> *this_00;
  mapped_type mVar1;
  mapped_type *__k;
  mapped_type *pmVar2;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_long,_CKeyID>_>,_std::_Rb_tree_iterator<std::pair<const_long,_CKeyID>_>_>
  pVar5;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock44;
  mapped_type local_40;
  unique_lock<std::recursive_mutex> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_device =
       &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore.super_recursive_mutex
  ;
  local_38._M_owns = false;
  local_40 = nIndex;
  std::unique_lock<std::recursive_mutex>::lock(&local_38);
  lVar3 = 0x2c0;
  if ((this->super_LegacyDataSPKM).set_pre_split_keypool._M_t._M_impl.super__Rb_tree_header.
      _M_node_count == 0) {
    lVar3 = 0x290;
  }
  lVar4 = 0x260;
  if (!fInternal) {
    lVar4 = lVar3;
  }
  std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
  _M_insert_unique<long_const&>
            ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
             ((long)&(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan +
             lVar4),&local_40);
  this_00 = &this->m_index_to_reserved_key;
  __k = std::map<long,_CKeyID,_std::less<long>,_std::allocator<std::pair<const_long,_CKeyID>_>_>::at
                  (this_00,&local_40);
  mVar1 = local_40;
  pmVar2 = std::
           map<CKeyID,_long,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_long>_>_>::
           operator[](&(this->super_LegacyDataSPKM).m_pool_key_to_index,__k);
  *pmVar2 = mVar1;
  pVar5 = std::
          _Rb_tree<long,_std::pair<const_long,_CKeyID>,_std::_Select1st<std::pair<const_long,_CKeyID>_>,_std::less<long>,_std::allocator<std::pair<const_long,_CKeyID>_>_>
          ::equal_range(&this_00->_M_t,&local_40);
  std::
  _Rb_tree<long,_std::pair<const_long,_CKeyID>,_std::_Select1st<std::pair<const_long,_CKeyID>_>,_std::less<long>,_std::allocator<std::pair<const_long,_CKeyID>_>_>
  ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar5.first._M_node,(_Base_ptr)pVar5.second._M_node);
  boost::signals2::
  signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
  ::operator()(&(this->super_LegacyDataSPKM).super_ScriptPubKeyMan.NotifyCanGetAddressesChanged);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_38);
  ScriptPubKeyMan::WalletLogPrintf<long>
            ((ScriptPubKeyMan *)this,(ConstevalFormatString<1U>)0x4acee0,&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void LegacyScriptPubKeyMan::ReturnDestination(int64_t nIndex, bool fInternal, const CTxDestination&)
{
    // Return to key pool
    {
        LOCK(cs_KeyStore);
        if (fInternal) {
            setInternalKeyPool.insert(nIndex);
        } else if (!set_pre_split_keypool.empty()) {
            set_pre_split_keypool.insert(nIndex);
        } else {
            setExternalKeyPool.insert(nIndex);
        }
        CKeyID& pubkey_id = m_index_to_reserved_key.at(nIndex);
        m_pool_key_to_index[pubkey_id] = nIndex;
        m_index_to_reserved_key.erase(nIndex);
        NotifyCanGetAddressesChanged();
    }
    WalletLogPrintf("keypool return %d\n", nIndex);
}